

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::resize_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          ssize_t sw,ssize_t sh)

{
  long y_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  invalid_argument *this_00;
  ssize_t xx;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  uint64_t sa22;
  uint64_t sb22;
  uint64_t sg22;
  uint64_t sr22;
  uint64_t sa21;
  uint64_t sb21;
  uint64_t sg21;
  uint64_t sr21;
  uint64_t sa12;
  uint64_t sb12;
  uint64_t sg12;
  uint64_t sr12;
  uint64_t sa11;
  uint64_t sb11;
  uint64_t sg11;
  uint64_t sr11;
  double local_a8;
  double local_a0;
  double local_98;
  long local_90;
  long local_88;
  long local_80;
  double local_78;
  double local_70;
  double local_68;
  Image *local_60;
  ssize_t local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_88 = y;
  local_60 = this;
  local_58 = x;
  if ((0 < w) && (0 < h)) {
    if (sw < 0) {
      sw = source->width;
    }
    if (sh < 0) {
      sh = source->height;
    }
    local_98 = (double)(h + -1);
    local_a0 = (double)(sh + -1);
    local_a8 = (double)sy;
    local_68 = (double)(w + -1);
    local_70 = (double)(sw + -1);
    local_78 = (double)sx;
    local_90 = h;
    for (local_80 = 0; local_80 != local_90; local_80 = local_80 + 1) {
      dVar15 = ((double)local_80 / local_98) * local_a0;
      dVar7 = dVar15 + local_a8;
      uVar1 = (ulong)dVar7;
      uVar1 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
      auVar9._8_4_ = (int)(uVar1 >> 0x20);
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      dVar15 = dVar15 - ((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      local_50 = 1.0 - dVar15;
      y_00 = local_80 + local_88;
      for (lVar6 = 0; w != lVar6; lVar6 = lVar6 + 1) {
        dVar8 = ((double)lVar6 / local_68) * local_70;
        dVar7 = dVar8 + local_78;
        uVar2 = (ulong)dVar7;
        sr11 = 0;
        sg11 = 0;
        sb11 = 0;
        sa11 = 0;
        sr12 = 0;
        sg12 = 0;
        sb12 = 0;
        sa12 = 0;
        sr21 = 0;
        sg21 = 0;
        sb21 = 0;
        sa21 = 0;
        sr22 = 0;
        sg22 = 0;
        sb22 = 0;
        uVar2 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
        sa22 = 0;
        read_pixel(source,uVar2,uVar1,&sr11,&sg11,&sb11,&sa11);
        auVar12._8_4_ = (int)(uVar2 >> 0x20);
        auVar12._0_8_ = uVar2;
        auVar12._12_4_ = 0x45300000;
        dVar7 = (double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0;
        dVar14 = auVar12._8_8_ - 1.9342813113834067e+25;
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          local_48 = dVar7;
          dStack_40 = dVar14;
          read_pixel(source,uVar2,uVar1 + 1,&sr12,&sg12,&sb12,&sa12);
          dVar7 = local_48;
          dVar14 = dStack_40;
        }
        dVar8 = dVar8 - (dVar14 + dVar7);
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          read_pixel(source,uVar2 + 1,uVar1,&sr21,&sg21,&sb21,&sa21);
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            read_pixel(source,uVar2 + 1,uVar1 + 1,&sr22,&sg22,&sb22,&sa22);
          }
        }
        auVar13._8_4_ = (int)(sr11 >> 0x20);
        auVar13._0_8_ = sr11;
        auVar13._12_4_ = 0x45300000;
        dVar14 = local_50 * (1.0 - dVar8);
        dVar7 = (1.0 - dVar8) * dVar15;
        dVar16 = local_50 * dVar8;
        dVar8 = dVar8 * dVar15;
        dVar19 = (((double)CONCAT44(0x45300000,(int)(sr22 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sr22) - 4503599627370496.0)) * dVar8 +
                 (((double)CONCAT44(0x45300000,(int)(sr21 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sr21) - 4503599627370496.0)) * dVar16 +
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sr11) - 4503599627370496.0)) * dVar14 +
                 (((double)CONCAT44(0x45300000,(int)(sr12 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sr12) - 4503599627370496.0)) * dVar7;
        uVar2 = (ulong)dVar19;
        dVar17 = (((double)CONCAT44(0x45300000,(int)(sg22 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sg22) - 4503599627370496.0)) * dVar8 +
                 (((double)CONCAT44(0x45300000,(int)(sg21 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sg21) - 4503599627370496.0)) * dVar16 +
                 (((double)CONCAT44(0x45300000,(int)(sg11 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sg11) - 4503599627370496.0)) * dVar14 +
                 (((double)CONCAT44(0x45300000,(int)(sg12 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sg12) - 4503599627370496.0)) * dVar7;
        uVar3 = (ulong)dVar17;
        dVar18 = (((double)CONCAT44(0x45300000,(int)(sb22 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sb22) - 4503599627370496.0)) * dVar8 +
                 (((double)CONCAT44(0x45300000,(int)(sb21 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sb21) - 4503599627370496.0)) * dVar16 +
                 (((double)CONCAT44(0x45300000,(int)(sb11 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sb11) - 4503599627370496.0)) * dVar14 +
                 (((double)CONCAT44(0x45300000,(int)(sb12 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sb12) - 4503599627370496.0)) * dVar7;
        uVar4 = (ulong)dVar18;
        auVar10._8_4_ = (int)(sa21 >> 0x20);
        auVar10._0_8_ = sa21;
        auVar10._12_4_ = 0x45300000;
        auVar11._8_4_ = (int)(sa22 >> 0x20);
        auVar11._0_8_ = sa22;
        auVar11._12_4_ = 0x45300000;
        dVar7 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa22) - 4503599627370496.0)) * dVar8 +
                ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa21) - 4503599627370496.0)) * dVar16 +
                (((double)CONCAT44(0x45300000,(int)(sa11 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa11) - 4503599627370496.0)) * dVar14 +
                (((double)CONCAT44(0x45300000,(int)(sa12 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sa12) - 4503599627370496.0)) * dVar7;
        uVar5 = (ulong)dVar7;
        write_pixel(local_60,local_58 + lVar6,y_00,
                    (long)(dVar19 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2,
                    (long)(dVar17 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3,
                    (long)(dVar18 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4,
                    (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
      }
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::invalid_argument::invalid_argument(this_00,"source width/height must be specified");
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void Image::resize_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, ssize_t sw, ssize_t sh) {
  if (w <= 0 || h <= 0) {
    throw invalid_argument("source width/height must be specified");
  }
  if (sw < 0) {
    sw = source.get_width();
  }
  if (sh < 0) {
    sh = source.get_height();
  }

  for (ssize_t yy = 0; yy < h; yy++) {
    double y_rel_dist = static_cast<double>(yy) / (h - 1);
    double source_y_progress = y_rel_dist * (sh - 1);
    size_t source_y1 = sy + source_y_progress;
    size_t source_y2 = source_y1 + 1;
    double source_y2_factor = source_y_progress - source_y1;
    double source_y1_factor = 1.0 - source_y2_factor;

    for (ssize_t xx = 0; xx < w; xx++) {
      double x_rel_dist = static_cast<double>(xx) / (w - 1);
      double source_x_progress = x_rel_dist * (sw - 1);
      size_t source_x1 = sx + source_x_progress;
      size_t source_x2 = source_x1 + 1;
      double source_x2_factor = source_x_progress - source_x1;
      double source_x1_factor = 1.0 - source_x2_factor;

      uint64_t sr11 = 0, sg11 = 0, sb11 = 0, sa11 = 0;
      uint64_t sr12 = 0, sg12 = 0, sb12 = 0, sa12 = 0;
      uint64_t sr21 = 0, sg21 = 0, sb21 = 0, sa21 = 0;
      uint64_t sr22 = 0, sg22 = 0, sb22 = 0, sa22 = 0;
      source.read_pixel(source_x1, source_y1, &sr11, &sg11, &sb11, &sa11);
      if (source_y2_factor != 0.0) {
        source.read_pixel(source_x1, source_y2, &sr12, &sg12, &sb12, &sa12);
      }
      if (source_x2_factor != 0.0) {
        source.read_pixel(source_x2, source_y1, &sr21, &sg21, &sb21, &sa21);
      }
      if (source_x2_factor != 0.0 && source_y2_factor != 0.0) {
        source.read_pixel(source_x2, source_y2, &sr22, &sg22, &sb22, &sa22);
      }

      uint64_t dr = sr11 * (source_x1_factor * source_y1_factor) +
          sr12 * (source_x1_factor * source_y2_factor) +
          sr21 * (source_x2_factor * source_y1_factor) +
          sr22 * (source_x2_factor * source_y2_factor);
      uint64_t dg = sg11 * (source_x1_factor * source_y1_factor) +
          sg12 * (source_x1_factor * source_y2_factor) +
          sg21 * (source_x2_factor * source_y1_factor) +
          sg22 * (source_x2_factor * source_y2_factor);
      uint64_t db = sb11 * (source_x1_factor * source_y1_factor) +
          sb12 * (source_x1_factor * source_y2_factor) +
          sb21 * (source_x2_factor * source_y1_factor) +
          sb22 * (source_x2_factor * source_y2_factor);
      uint64_t da = sa11 * (source_x1_factor * source_y1_factor) +
          sa12 * (source_x1_factor * source_y2_factor) +
          sa21 * (source_x2_factor * source_y1_factor) +
          sa22 * (source_x2_factor * source_y2_factor);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}